

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

stbtt__buf stbtt__cff_get_index(stbtt__buf *b)

{
  int o;
  byte bVar1;
  stbtt_uint32 sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  stbtt__buf sVar6;
  
  o = b->cursor;
  sVar2 = stbtt__buf_get(b,2);
  if (sVar2 == 0) {
    iVar4 = b->cursor;
  }
  else {
    bVar1 = stbtt__buf_get8(b);
    iVar5 = sVar2 * bVar1 + b->cursor;
    iVar4 = b->size;
    iVar3 = iVar5;
    if (iVar4 < iVar5) {
      iVar3 = iVar4;
    }
    if (iVar5 < 0) {
      iVar3 = iVar4;
    }
    b->cursor = iVar3;
    sVar2 = stbtt__buf_get(b,(uint)bVar1);
    iVar3 = b->size;
    iVar5 = sVar2 + b->cursor + -1;
    iVar4 = iVar5;
    if (iVar3 < iVar5) {
      iVar4 = iVar3;
    }
    if (iVar5 < 0) {
      iVar4 = iVar3;
    }
    b->cursor = iVar4;
  }
  sVar6 = stbtt__buf_range(b,o,iVar4 - o);
  return sVar6;
}

Assistant:

static stbtt__buf stbtt__cff_get_index(stbtt__buf *b)
{
int count, start, offsize;
start = b->cursor;
count = stbtt__buf_get16(b);
if (count) {
offsize = stbtt__buf_get8(b);
STBTT_assert(offsize >= 1 && offsize <= 4);
stbtt__buf_skip(b, offsize * count);
stbtt__buf_skip(b, stbtt__buf_get(b, offsize) - 1);
}
return stbtt__buf_range(b, start, b->cursor - start);
}